

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMInstPrinter.c
# Opt level: O0

void EVM_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  char *fmt;
  SStream *in_RSI;
  long in_RDI;
  uint i;
  SStream *ss;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar1;
  
  ss = in_RSI;
  fmt = EVM_insn_name(*(csh *)(in_RDI + 800),*(uint *)(in_RDI + 8));
  SStream_concat(ss,fmt);
  if ((0x5f < *(uint *)(in_RDI + 8)) && (*(uint *)(in_RDI + 8) < 0x80)) {
    SStream_concat0((SStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    ss->buffer);
    for (uVar1 = 0; uVar1 < *(int *)(in_RDI + 8) - 0x5fU; uVar1 = uVar1 + 1) {
      SStream_concat(in_RSI,"%02x",(ulong)*(byte *)(in_RDI + 0x339 + (ulong)uVar1));
    }
  }
  return;
}

Assistant:

void EVM_printInst(MCInst *MI, struct SStream *O, void *PrinterInfo)
{
	SStream_concat(O, EVM_insn_name((csh)MI->csh, MI->Opcode));

	if (MI->Opcode >= EVM_INS_PUSH1 && MI->Opcode <= EVM_INS_PUSH32) {
		unsigned int i;

		SStream_concat0(O, "\t");
		for (i = 0; i < MI->Opcode - EVM_INS_PUSH1 + 1; i++) {
			SStream_concat(O, "%02x", MI->evm_data[i]);
		}
	}
}